

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_adpcm.cpp
# Opt level: O0

void __thiscall
ymfm::adpcm_b_channel::output<2>(adpcm_b_channel *this,ymfm_output<2> *output,uint32_t rshift)

{
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  int32_t result;
  uint32_t rshift_local;
  ymfm_output<2> *output_local;
  adpcm_b_channel *this_local;
  
  iVar5 = this->m_prev_accum;
  uVar1 = this->m_position;
  iVar2 = this->m_accumulator;
  uVar4 = this->m_position;
  uVar3 = adpcm_b_registers::level(this->m_regs);
  iVar5 = (int)(((int)(iVar5 * ((uVar1 ^ 0xffff) + 1) + iVar2 * uVar4) >> 0x10) * uVar3) >>
          ((char)rshift + 8U & 0x1f);
  uVar4 = adpcm_b_registers::pan_left(this->m_regs);
  if (uVar4 != 0) {
    output->data[0] = iVar5 + output->data[0];
  }
  uVar4 = adpcm_b_registers::pan_right(this->m_regs);
  if (uVar4 != 0) {
    output->data[1] = iVar5 + output->data[1];
  }
  return;
}

Assistant:

void adpcm_b_channel::output(ymfm_output<NumOutputs> &output, uint32_t rshift) const
{
	// mask out some channels for debug purposes
	if ((debug::GLOBAL_ADPCM_B_CHANNEL_MASK & 1) == 0)
		return;

	// do a linear interpolation between samples
	int32_t result = (m_prev_accum * int32_t((m_position ^ 0xffff) + 1) + m_accumulator * int32_t(m_position)) >> 16;

	// apply volume (level) in a linear fashion and reduce
	result = (result * int32_t(m_regs.level())) >> (8 + rshift);

	// apply to left/right
	if (NumOutputs == 1 || m_regs.pan_left())
		output.data[0] += result;
	if (NumOutputs > 1 && m_regs.pan_right())
		output.data[1] += result;
}